

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_LadderDatabase.cpp
# Opt level: O1

pair<RenX::LadderDatabase::Entry_*,_unsigned_long> __thiscall
RenX::LadderDatabase::getPlayerEntryAndIndex(LadderDatabase *this,uint64_t steamid)

{
  Entry *pEVar1;
  unsigned_long uVar2;
  pair<RenX::LadderDatabase::Entry_*,_unsigned_long> pVar3;
  
  pEVar1 = this->m_head;
  if (pEVar1 != (Entry *)0x0) {
    uVar2 = 0;
    do {
      if (pEVar1->steam_id == steamid) {
        pVar3.second = uVar2;
        pVar3.first = pEVar1;
        return pVar3;
      }
      uVar2 = uVar2 + 1;
      pEVar1 = pEVar1->next;
    } while (pEVar1 != (Entry *)0x0);
  }
  return (pair<RenX::LadderDatabase::Entry_*,_unsigned_long>)(ZEXT816(0xffffffffffffffff) << 0x40);
}

Assistant:

std::pair<RenX::LadderDatabase::Entry *, size_t> RenX::LadderDatabase::getPlayerEntryAndIndex(uint64_t steamid) const {
	size_t index = 0;
	for (Entry *itr = m_head; itr != nullptr; itr = itr->next, ++index) {
		if (itr->steam_id == steamid) {
			return std::pair<Entry*, size_t>(itr, index);
		}
	}
	return std::pair<Entry*, size_t>(nullptr, SIZE_MAX);
}